

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O1

uint64_t to_msr_pl_psys_spr(double watts,double power_units)

{
  uint64_t uVar1;
  ulong uVar2;
  
  if (watts < 0.0) {
    __assert_fail("watts >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x79,"uint64_t to_msr_pl_psys_spr(double, double)");
  }
  if (0.0 < power_units) {
    uVar2 = (ulong)(watts / power_units);
    uVar1 = (long)(watts / power_units - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    if (0x1ffff < uVar1) {
      to_msr_pl_psys_spr_cold_1();
      uVar1 = 0x1ffff;
    }
    return uVar1;
  }
  __assert_fail("power_units > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x7a,"uint64_t to_msr_pl_psys_spr(double, double)");
}

Assistant:

static uint64_t to_msr_pl_psys_spr(double watts, double power_units) {
  assert(watts >= 0);
  assert(power_units > 0);
  // Lower bound is 0, but upper bound is limited by what fits in 17 bits
  static const uint64_t MSR_POWER_MAX = 0x1FFFF;
  uint64_t bits = (uint64_t) (watts / power_units);
  if (bits > MSR_POWER_MAX) {
    raplcap_log(WARN, "Power limit too large: %.12f W, using max: %.12f W\n", watts, MSR_POWER_MAX * power_units);
    bits = MSR_POWER_MAX;
  }
  raplcap_log(DEBUG, "to_msr_pl_psys_spr: watts=%.12f, power_units=%.12f, bits=0x%04lX\n", watts, power_units, bits);
  return bits;
}